

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void lshbox::loadFvecs<float>(Matrix<float> *data,string *dataFile)

{
  uint uVar1;
  uint uVar2;
  uint _N;
  ostream *poVar3;
  char *__assertion;
  int iVar4;
  int dimension;
  int dim;
  ifstream fin;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&fin,(dataFile->_M_dataplus)._M_p,_S_bin|_S_ate);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
    uVar2 = std::istream::tellg();
    std::istream::seekg((long)&fin,_S_beg);
    if (uVar2 == 0) {
      __assertion = "fileSize != 0";
      uVar2 = 0x34;
    }
    else {
      std::istream::read((char *)&fin,(long)&dimension);
      uVar1 = dimension * 4 + 4;
      _N = uVar2 / uVar1;
      if (uVar2 % uVar1 == 0) {
        Matrix<float>::reset(data,dimension,_N);
        std::istream::read((char *)&fin,(long)data->dims);
        iVar4 = 1;
        while( true ) {
          if ((int)_N <= iVar4) {
            std::ifstream::close();
            std::ifstream::~ifstream(&fin);
            return;
          }
          std::istream::read((char *)&fin,(long)&dim);
          if (dim != dimension) break;
          std::istream::read((char *)&fin,(long)(data->dims + dim * iVar4));
          iVar4 = iVar4 + 1;
        }
        __assertion = "dim == dimension";
        uVar2 = 0x42;
      }
      else {
        __assertion = "fileSize % bytesPerRecord == 0";
        uVar2 = 0x39;
      }
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"cannot open file ");
    poVar3 = std::operator<<(poVar3,(dataFile->_M_dataplus)._M_p);
    std::endl<char,std::char_traits<char>>(poVar3);
    __assertion = "false";
    uVar2 = 0x30;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/common/util.h"
                ,uVar2,
                "void lshbox::loadFvecs(lshbox::Matrix<DATATYPE> &, const string &) [DATATYPE = float]"
               );
}

Assistant:

void loadFvecs(lshbox::Matrix<DATATYPE>& data, const string& dataFile) {
        std::ifstream fin(dataFile.c_str(), std::ios::binary | std::ios::ate);
        if (!fin) {
            std::cout << "cannot open file " << dataFile.c_str() << std::endl;
            assert(false);
        }
        unsigned fileSize = fin.tellg();
        fin.seekg(0, fin.beg);
        assert(fileSize != 0);

        int dimension;
        fin.read((char*)&dimension, sizeof(int));
        unsigned bytesPerRecord = dimension * sizeof(DATATYPE) + 4;
        assert(fileSize % bytesPerRecord == 0);
        int cardinality = fileSize / bytesPerRecord;

        data.reset(dimension, cardinality);
        fin.read((char *)(data.getData()), sizeof(float) * dimension);

        int dim;
        for (int i = 1; i < cardinality; ++i) {
            fin.read((char*)&dim, sizeof(int));
            assert(dim == dimension);
            fin.read((char *)(data.getData() + i * dimension), sizeof(float) * dimension);
        }
        fin.close();
    }